

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

get_result * __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::get_internal(get_result *__return_storage_ptr__,
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *this,art_key_type k)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __n;
  in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *piVar6;
  ulong uVar7;
  ulong uVar8;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header> *leaf;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_00;
  ulong uVar9;
  void *pvVar10;
  void *__src;
  find_result fVar11;
  uint64_t local_40;
  get_result *local_38;
  
  uVar5 = k.field_0._8_8_;
  uVar4 = (this->root).tagged_ptr;
  uVar8 = uVar5;
  __src = k.field_0._0_8_;
  local_38 = __return_storage_ptr__;
  if (uVar4 == 0) {
LAB_0014220f:
    (local_38->super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>)
    ._M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
    _M_engaged = false;
  }
  else {
    do {
      this_00 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *)(uVar4 & 0xfffffffffffffff8);
      if ((uVar4 & 7) == 0) {
        uVar8 = (ulong)*(uint *)&this_00->k_prefix;
        uVar4 = uVar5;
        if (uVar8 < uVar5) {
          uVar4 = uVar8;
        }
        iVar3 = bcmp(k.field_0._0_8_,&this_00->children_count,uVar4);
        if (iVar3 == 0 && uVar8 == uVar5) {
          uVar2 = *(uint *)((long)&this_00->k_prefix + 4);
          (local_38->
          super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>).
          _M_payload.
          super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
          _M_payload._M_value._M_ptr = &(&this_00->children_count)[uVar8].value;
          *(ulong *)((long)&(local_38->
                            super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                            )._M_payload.
                            super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>
                            ._M_payload + 8) = (ulong)uVar2;
          (local_38->
          super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>).
          _M_payload.
          super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
          _M_engaged = true;
          return local_38;
        }
        goto LAB_0014220f;
      }
      bVar1 = *(byte *)((long)&this_00->k_prefix + 7);
      uVar9 = (ulong)bVar1;
      if (7 < bVar1) {
        __assert_fail("result <= key_prefix_capacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x298,
                      "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<std::span<const std::byte>>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<std::span<const std::byte>>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy]"
                     );
      }
      local_40 = 0;
      __n = 8;
      if (uVar8 < 8) {
        __n = uVar8;
      }
      memcpy(&local_40,__src,__n);
      uVar2 = detail::
              key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
              ::get_shared_length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                                   *)this_00,local_40);
      if (uVar2 < bVar1) goto LAB_0014220f;
      uVar7 = uVar8 - uVar9;
      if (uVar8 < uVar9) {
LAB_0014222a:
        __assert_fail("num_bytes <= key.size_bytes()",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                      ,0xc0,
                      "void unodb::detail::basic_art_key<std::span<const std::byte>>::shift_right(const std::size_t) [KeyType = std::span<const std::byte>]"
                     );
      }
      pvVar10 = (void *)((long)__src + uVar9);
      fVar11 = detail::
               basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               ::find_child(this_00,(node_type)uVar4 & (I256|I48),*(byte *)((long)__src + uVar9));
      piVar6 = fVar11.second;
      if (piVar6 == (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
                     *)0x0) {
        (local_38->
        super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>).
        _M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>
        ._M_engaged = false;
      }
      else {
        if (uVar7 == 0) goto LAB_0014222a;
        uVar4 = (piVar6->value).tagged_ptr;
        uVar7 = uVar7 - 1;
        pvVar10 = (void *)((long)pvVar10 + 1);
      }
      uVar8 = uVar7;
      __src = pvVar10;
    } while (piVar6 != (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
                        *)0x0);
  }
  return local_38;
}

Assistant:

typename db<Key, Value>::get_result db<Key, Value>::get_internal(
    art_key_type k) const noexcept {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) return {};

  auto node{root};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (leaf->matches(k)) return leaf->get_value_view();
      return {};
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    if (key_prefix.get_shared_length(remaining_key) < key_prefix_length)
      return {};
    remaining_key.shift_right(key_prefix_length);
    const auto* const child{
        inode->find_child(node_type, remaining_key[0]).second};
    if (child == nullptr) return {};

    node = *child;
    remaining_key.shift_right(1);
  }
}